

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O2

void __thiscall
QHttpNetworkConnectionChannel::_q_sslErrors
          (QHttpNetworkConnectionChannel *this,QList<QSslError> *errors)

{
  ConnectionType CVar1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_node_base *p_Var3;
  long in_FS_OFFSET;
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>_>
  local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(this + 0x10) != 0) {
    QHttpNetworkConnectionPrivate::pauseConnection
              (*(QHttpNetworkConnectionPrivate **)(*(long *)(this + 0xf8) + 8));
    if ((this[0x58] == (QHttpNetworkConnectionChannel)0x1) && (*(long *)(this + 0x38) == 0)) {
      QHttpNetworkConnectionPrivate::dequeueRequest
                (*(QHttpNetworkConnectionPrivate **)(*(long *)(this + 0xf8) + 8),
                 *(QIODevice **)(this + 0x10));
    }
    CVar1 = QHttpNetworkConnection::connectionType(*(QHttpNetworkConnection **)(this + 0xf8));
    if (CVar1 == ConnectionTypeHTTP) {
      if (*(QHttpNetworkReply **)(this + 0x38) != (QHttpNetworkReply *)0x0) {
        QHttpNetworkReply::sslErrors(*(QHttpNetworkReply **)(this + 0x38),errors);
      }
    }
    else {
      local_30.d.ptr =
           *(totally_ordered_wrapper<QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>_*>
             *)(this + 0x80);
      if (local_30.d.ptr ==
          (QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>
           *)0x0) {
        p_Var2 = (_Rb_tree_node_base *)0x0;
      }
      else {
        LOCK();
        (((QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>
           *)local_30.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
             (((QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>
                *)local_30.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        p_Var2 = (((QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>
                    *)local_30.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      p_Var3 = &(((QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>
                   *)local_30.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (local_30.d.ptr ==
          (QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>
           *)0x0) {
        p_Var3 = (_Rb_tree_node_base *)0x0;
      }
      for (; p_Var2 != p_Var3; p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
        QHttpNetworkReply::sslErrors((QHttpNetworkReply *)p_Var2[1]._M_right,errors);
      }
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2(&local_30);
    }
    QHttpNetworkConnectionPrivate::resumeConnection
              (*(QHttpNetworkConnectionPrivate **)(*(long *)(this + 0xf8) + 8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttpNetworkConnectionChannel::_q_sslErrors(const QList<QSslError> &errors)
{
    if (!socket)
        return;
    //QNetworkReply::NetworkError errorCode = QNetworkReply::ProtocolFailure;
    // Also pause the connection because socket notifiers may fire while an user
    // dialog is displaying
    connection->d_func()->pauseConnection();
    if (pendingEncrypt && !reply)
        connection->d_func()->dequeueRequest(socket);
    if (connection->connectionType() == QHttpNetworkConnection::ConnectionTypeHTTP) {
        if (reply)
            emit reply->sslErrors(errors);
    }
#ifndef QT_NO_SSL
    else { // HTTP/2
        const auto h2RequestsToSendCopy = h2RequestsToSend;
        for (const auto &httpMessagePair : h2RequestsToSendCopy) {
            // emit SSL errors for all replies
            QHttpNetworkReply *currentReply = httpMessagePair.second;
            Q_ASSERT(currentReply);
            emit currentReply->sslErrors(errors);
        }
    }
#endif // QT_NO_SSL
    connection->d_func()->resumeConnection();
}